

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O2

int32 mgau_eval(mgau_model_t *g,int32 m,int32 *active,float32 *x,int32 fr,int32 update_best_id)

{
  uint veclen;
  logmath_t *lmath;
  double dVar1;
  int iVar2;
  int32 iVar3;
  ulong uVar4;
  int32 j;
  uint c;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int logb_y;
  int iVar8;
  long lVar9;
  mgau_t *mgau;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  float64 fVar17;
  float64 fVar18;
  
  if (g->comp_type == 0x4e23) {
    veclen = g->veclen;
    mgau = g->mgau + m;
    if (update_best_id != 0) {
      mgau->bstidx = -1;
      mgau->bstscr = -0x38000000;
      mgau->updatetime = fr;
    }
    dVar16 = (double)g->distfloor;
    lmath = g->logmath;
    fVar17 = logmath_get_base(lmath);
    dVar14 = log((double)fVar17);
    uVar6 = 0;
    if (0 < (int)veclen) {
      uVar6 = (ulong)veclen;
    }
    dVar14 = 1.0 / dVar14;
    if (active == (int32 *)0x0) {
      iVar2 = -0x38000000;
      uVar4 = 0;
      while( true ) {
        c = (uint)uVar4;
        if ((long)mgau->n_comp + -1 <= (long)uVar4) break;
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar17 = (float64)(double)(float)*(undefined8 *)(mgau->lrd + uVar4);
          fVar18 = (float64)(double)(float)((ulong)*(undefined8 *)(mgau->lrd + uVar4) >> 0x20);
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            dVar15 = (double)((float)x[uVar7] - (float)mgau->mean[uVar4][uVar7]);
            dVar1 = (double)((float)x[uVar7] - (float)mgau->mean[uVar4 + 1][uVar7]);
            fVar17 = (float64)((double)fVar17 -
                              dVar15 * dVar15 * (double)(float)mgau->var[uVar4][uVar7]);
            fVar18 = (float64)((double)fVar18 -
                              dVar1 * dVar1 * (double)(float)mgau->var[uVar4 + 1][uVar7]);
          }
        }
        else {
          fVar17 = mgau_density_full(mgau,veclen,c,x);
          fVar18 = mgau_density_full(mgau,veclen,c | 1,x);
        }
        uVar10 = SUB84(dVar16,0);
        uVar12 = (undefined4)((ulong)dVar16 >> 0x20);
        uVar11 = uVar10;
        uVar13 = uVar12;
        if (dVar16 <= (double)fVar17) {
          uVar11 = SUB84(fVar17,0);
          uVar13 = (undefined4)((ulong)fVar17 >> 0x20);
        }
        iVar8 = (int)((double)CONCAT44(uVar13,uVar11) * dVar14) + mgau->mixw[uVar4];
        iVar2 = logmath_add(lmath,iVar2,iVar8);
        if (mgau->bstscr < iVar8) {
          mgau->bstidx = c;
          mgau->bstscr = iVar8;
        }
        if (dVar16 <= (double)fVar18) {
          uVar10 = SUB84(fVar18,0);
          uVar12 = (undefined4)((ulong)fVar18 >> 0x20);
        }
        iVar8 = (int)((double)CONCAT44(uVar12,uVar10) * dVar14) + mgau->mixw[uVar4 + 1];
        iVar2 = logmath_add(lmath,iVar2,iVar8);
        if ((update_best_id != 0) && (mgau->bstscr < iVar8)) {
          mgau->bstidx = c | 1;
          mgau->bstscr = iVar8;
        }
        uVar4 = uVar4 + 2;
      }
      if ((int)c < mgau->n_comp) {
        uVar4 = uVar4 & 0xffffffff;
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar17 = (float64)(double)(float)mgau->lrd[uVar4];
          for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
            dVar15 = (double)((float)x[uVar7] - (float)mgau->mean[uVar4][uVar7]);
            fVar17 = (float64)((double)fVar17 -
                              dVar15 * dVar15 * (double)(float)mgau->var[uVar4][uVar7]);
          }
        }
        else {
          fVar17 = mgau_density_full(mgau,veclen,c,x);
        }
        if (dVar16 <= (double)fVar17) {
          dVar16 = (double)fVar17;
        }
        iVar8 = (int)(dVar14 * dVar16) + mgau->mixw[uVar4];
        iVar2 = logmath_add(lmath,iVar2,iVar8);
        if ((update_best_id != 0) && (mgau->bstscr < iVar8)) {
          mgau->bstidx = c;
          mgau->bstscr = iVar8;
        }
      }
    }
    else {
      iVar2 = -0x38000000;
      lVar5 = 0;
      while( true ) {
        iVar8 = active[lVar5];
        lVar9 = (long)iVar8;
        if (lVar9 < 0) break;
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar17 = (float64)(double)(float)mgau->lrd[lVar9];
          for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
            dVar15 = (double)((float)x[uVar4] - (float)mgau->mean[lVar9][uVar4]);
            fVar17 = (float64)((double)fVar17 -
                              dVar15 * dVar15 * (double)(float)mgau->var[lVar9][uVar4]);
          }
          if ((double)fVar17 < dVar16) {
            fVar17 = (float64)dVar16;
          }
        }
        else {
          fVar17 = mgau_density_full(mgau,veclen,iVar8,x);
        }
        logb_y = (int)((double)fVar17 * dVar14) + mgau->mixw[lVar9];
        iVar2 = logmath_add(lmath,iVar2,logb_y);
        if ((update_best_id != 0) && (mgau->bstscr < logb_y)) {
          mgau->bstidx = iVar8;
          mgau->bstscr = logb_y;
        }
        lVar5 = lVar5 + 1;
      }
    }
    iVar3 = -0x38000000;
    if (-0x38000000 < iVar2) {
      iVar3 = iVar2;
    }
    return iVar3;
  }
  __assert_fail("g->comp_type == MIX_INT_FLOAT_COMP",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                ,0x4a1,"int32 mgau_eval(mgau_model_t *, int32, int32 *, float32 *, int32, int32)");
}

Assistant:

int32
mgau_eval(mgau_model_t * g, int32 m, int32 * active, float32 * x, int32 fr,
          int32 update_best_id)
{
    mgau_t *mgau;
    int32 veclen, score;

    veclen = mgau_veclen(g);
    mgau = &(g->mgau[m]);
    assert(g->comp_type == MIX_INT_FLOAT_COMP);

    if (update_best_id) {
        mgau->bstidx = NO_BSTIDX;
        mgau->bstscr = S3_LOGPROB_ZERO;
        mgau->updatetime = fr;
    }

    if (!active) {              /* No short list; use all */
        score =
            mgau_eval_all(mgau, x, veclen, g->distfloor, update_best_id, g->logmath);
    }
    else {
        score =
            mgau_eval_active(mgau, x, veclen, g->distfloor, active,
                             update_best_id, g->logmath);
    }

    if (score <= S3_LOGPROB_ZERO) {
        /*      E_INFO("Warning!! Score is S3_LOGPROB_ZERO\n"); */
        score = S3_LOGPROB_ZERO;
    }
    return score;
}